

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx2::forward
          (Yolov3DetectionOutput_x86_avx2 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  pointer pMVar2;
  _func_int *p_Var3;
  void *pvVar4;
  size_t sVar5;
  iterator __position;
  Mat *this_01;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined8 uVar12;
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  long lVar16;
  undefined8 uVar17;
  undefined4 *puVar18;
  _func_int *p_Var19;
  float *pfVar20;
  undefined4 uVar21;
  BBoxRect *__args;
  int iVar22;
  long lVar23;
  size_t sVar24;
  uint uVar25;
  long in_R10;
  long lVar26;
  float *pfVar27;
  uint uVar28;
  ulong uVar29;
  float fVar30;
  float fVar31;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar40 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_1c8;
  ulong local_1b0;
  BBoxRect local_1a8;
  long local_180;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_178;
  undefined1 local_158 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_140;
  pointer local_138;
  void *local_130;
  long local_128;
  float *local_120;
  float *local_118;
  float *local_110;
  float *local_108;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_100;
  Option *local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  Yolov3DetectionOutput_x86_avx2 *local_d8;
  long local_d0;
  undefined8 local_c8;
  void *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  undefined1 auVar41 [16];
  
  local_178.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140 = bottom_blobs;
  local_100 = top_blobs;
  local_f8 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_1b0 = 0;
    local_d8 = this;
    do {
      local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
      local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_1c8,
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]));
      pMVar2 = (local_140->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      p_Var3 = this->_vptr_Yolov3DetectionOutput_x86_avx2[-3];
      iVar14 = pMVar2[local_1b0].c / *(int *)(&this->field_0xd4 + (long)p_Var3);
      if (iVar14 != *(int *)(&this->field_0xd0 + (long)p_Var3) + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_1c8);
        iVar14 = -1;
        goto LAB_002b9189;
      }
      if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3])) {
        local_138 = pMVar2 + local_1b0;
        uVar29._0_4_ = local_138->w;
        uVar29._4_4_ = local_138->h;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar29;
        auVar7 = vcvtdq2ps_avx(auVar32);
        p_Var19 = (_func_int *)
                  ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 +
                  (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]);
        fVar30 = *(float *)(*(long *)(&this->field_0x170 + (long)p_Var3) + local_1b0 * 4);
        auVar46._0_4_ = fVar30 * auVar7._0_4_;
        auVar46._4_4_ = fVar30 * auVar7._4_4_;
        auVar46._8_4_ = fVar30 * auVar7._8_4_;
        auVar46._12_4_ = fVar30 * auVar7._12_4_;
        uVar21 = vextractps_avx(auVar32,1);
        local_128 = CONCAT44((int)((ulong)*(long *)(&this->field_0x170 + (long)p_Var3) >> 0x20),
                             uVar21);
        in_R10 = CONCAT44((int)((ulong)in_R10 >> 0x20),(undefined4)uVar29);
        local_b8 = vroundps_avx(auVar46,0xb);
        local_e8 = (long)iVar14;
        auVar33._0_12_ = ZEXT412(0x3f000000) << 0x40;
        auVar33._12_4_ = 0x3f000000;
        register0x00001288 = auVar33._8_8_;
        local_98 = auVar7._0_8_;
        auVar7 = vrcpps_avx(_local_98);
        auVar40._8_4_ = 0x3f800000;
        auVar40._0_8_ = 0x3f8000003f800000;
        auVar40._12_4_ = 0x3f800000;
        auVar32 = vfmsub213ps_fma(auVar7,_local_98,auVar40);
        _local_a8 = vfnmadd132ps_fma(auVar32,auVar7,auVar7);
        local_f0 = (long)*(int *)(&this->field_0xd4 + (long)p_Var3) * local_1b0 * 4;
        lVar23 = 0;
        local_d0 = in_R10;
        do {
          lVar26 = lVar23 * local_e8;
          if (local_138->dims == 3) {
            sVar24 = local_138->elemsize;
            local_130 = (void *)((lVar26 + 5) * local_138->cstep * sVar24 + (long)local_138->data);
            lVar16 = (long)local_138->h * (long)local_138->w * sVar24;
          }
          else {
            sVar24 = local_138->elemsize;
            local_130 = (void *)((lVar26 + 5) * local_138->cstep * sVar24 + (long)local_138->data);
            lVar16 = (long)local_138->h * (long)local_138->w * (long)local_138->d * sVar24;
          }
          auVar7._8_8_ = 0;
          auVar7._0_8_ = sVar24;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = lVar16 + 0xfU & 0xfffffffffffffff0;
          uVar17 = SUB168(auVar6 / auVar7,0);
          local_180 = lVar23;
          if (0 < (int)local_128) {
            auVar34._8_8_ = 0;
            auVar34._0_8_ =
                 *(ulong *)(*(long *)(p_Var19 + 0xe0) +
                           (long)((int)*(float *)(*(long *)(p_Var19 + 0x128) + local_f0 + lVar23 * 4
                                                 ) * 2) * 4);
            sVar24 = local_138->cstep;
            pvVar4 = local_138->data;
            sVar5 = local_138->elemsize;
            local_108 = (float *)(sVar24 * lVar26 * sVar5 + (long)pvVar4);
            local_110 = (float *)((lVar26 + 1) * sVar24 * sVar5 + (long)pvVar4);
            local_118 = (float *)((lVar26 + 2) * sVar24 * sVar5 + (long)pvVar4);
            local_120 = (float *)((lVar26 + 3) * sVar24 * sVar5 + (long)pvVar4);
            pfVar27 = (float *)((lVar26 + 4) * sVar24 * sVar5 + (long)pvVar4);
            uVar28 = SUB164(auVar6 / auVar7,0);
            auVar7 = vpinsrd_avx(ZEXT416(uVar28 * 4),uVar28 * 5,1);
            auVar7 = vpinsrd_avx(auVar7,uVar28 * 6,2);
            auVar7 = vpinsrd_avx(auVar7,uVar28 * 7,3);
            auVar32 = vpunpckldq_avx(ZEXT416(uVar28 * 2),ZEXT416(uVar28 * 3));
            auVar32 = vshufps_avx(ZEXT416(uVar28),auVar32,0x41);
            local_58._16_16_ = auVar7;
            local_58._0_16_ = auVar32;
            auVar41._8_4_ = 0x3f800000;
            auVar41._0_8_ = 0x3f8000003f800000;
            auVar41._12_4_ = 0x3f800000;
            auVar45 = ZEXT1664(auVar41);
            local_88 = vmovlhps_avx(auVar41,auVar34);
            lVar23 = 0;
            local_c8 = uVar17;
            do {
              local_e0 = lVar23;
              if (0 < (int)in_R10) {
                auVar35._0_4_ = (float)(int)lVar23;
                local_c0 = (void *)((long)local_130 + lVar23 * in_R10 * 4);
                auVar35._4_4_ = auVar35._0_4_;
                auVar35._8_4_ = auVar35._0_4_;
                auVar35._12_4_ = auVar35._0_4_;
                local_78 = vunpcklpd_avx(auVar35,local_b8);
                lVar23 = 0;
                do {
                  pfVar1 = (float *)((long)local_c0 + lVar23 * 4);
                  p_Var3 = this->_vptr_Yolov3DetectionOutput_x86_avx2[-3];
                  iVar14 = (*(uint *)(&this->field_0xd0 + (long)p_Var3) & 0xfffffff8) * (int)uVar17;
                  pfVar20 = pfVar1;
                  if (iVar14 < 1) {
                    iVar15 = 0;
                    auVar51 = ZEXT464(0xff7fffff);
                    iVar22 = 0;
                  }
                  else {
                    iVar22 = 0;
                    auVar51 = ZEXT464(0xff7fffff);
                    iVar15 = 0;
                    do {
                      auVar9 = vpcmpeqd_avx2(auVar45._0_32_,auVar45._0_32_);
                      auVar39 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar9);
                      auVar9 = vpermpd_avx2(auVar39,0x4e);
                      auVar9 = vmaxps_avx(auVar39,auVar9);
                      auVar8 = vshufpd_avx(auVar9,auVar9,5);
                      auVar9 = vmaxps_avx(auVar9,auVar8);
                      auVar8 = vshufps_avx(auVar9,auVar9,0xb1);
                      auVar9 = vmaxps_avx(auVar9,auVar8);
                      auVar45 = ZEXT3264(auVar9);
                      if (auVar51._0_4_ < auVar9._0_4_) {
                        auVar8 = vcmpps_avx(auVar39,auVar9,0);
                        uVar25 = vmovmskps_avx(auVar8);
                        iVar22 = 0;
                        if (uVar25 != 0) {
                          for (; (uVar25 >> iVar22 & 1) == 0; iVar22 = iVar22 + 1) {
                          }
                        }
                        iVar22 = iVar22 + iVar15;
                        auVar51 = ZEXT1664(auVar9._0_16_);
                      }
                      pfVar20 = pfVar20 + (int)(uVar28 * 8);
                      iVar15 = iVar15 + 8;
                    } while (pfVar20 < pfVar1 + iVar14);
                  }
                  for (; local_158 = auVar51._0_16_,
                      pfVar20 < pfVar1 + (int)(*(uint *)(&this->field_0xd0 + (long)p_Var3) *
                                              (int)uVar17); pfVar20 = pfVar20 + (int)uVar28) {
                    if (auVar51._0_4_ < *pfVar20) {
                      iVar22 = iVar15;
                    }
                    auVar7 = vmaxss_avx(ZEXT416((uint)*pfVar20),local_158);
                    auVar51 = ZEXT1664(auVar7);
                    iVar15 = iVar15 + 1;
                  }
                  fVar30 = expf(-*pfVar27);
                  fVar31 = expf(-(float)local_158._0_4_);
                  this = local_d8;
                  auVar45 = ZEXT464(0x3f800000);
                  auVar7 = vfmadd132ss_fma(ZEXT416((uint)(fVar31 + 1.0)),auVar45._0_16_,
                                           ZEXT416((uint)fVar30));
                  fVar30 = 1.0 / auVar7._0_4_;
                  if (*(float *)(&local_d8->field_0xd8 + (long)p_Var3) <= fVar30) {
                    fVar31 = expf(-*local_108);
                    local_158 = ZEXT416((uint)(fVar31 + 1.0));
                    fVar31 = expf(-*local_110);
                    local_68 = vinsertps_avx(local_158,ZEXT416((uint)(fVar31 + 1.0)),0x10);
                    local_158._0_4_ = expf(*local_118);
                    local_158._4_4_ = extraout_XMM0_Db;
                    local_158._8_4_ = extraout_XMM0_Dc;
                    local_158._12_4_ = extraout_XMM0_Dd;
                    auVar45._0_4_ = expf(*local_120);
                    auVar45._4_60_ = extraout_var;
                    auVar7 = vrcpps_avx(local_68);
                    auVar47._0_4_ = local_88._0_4_ * auVar7._0_4_;
                    auVar47._4_4_ = local_88._4_4_ * auVar7._4_4_;
                    auVar47._8_4_ = local_88._8_4_ * auVar7._8_4_;
                    auVar47._12_4_ = local_88._12_4_ * auVar7._12_4_;
                    auVar32 = vfmsub213ps_fma(local_68,auVar47,local_88);
                    auVar33 = vfnmadd213ps_fma(auVar32,auVar7,auVar47);
                    auVar42._8_8_ = local_158._0_8_;
                    auVar42._0_8_ = local_158._0_8_;
                    auVar7 = vinsertps_avx(auVar42,auVar45._0_16_,0x30);
                    auVar10._4_8_ = auVar7._8_8_;
                    auVar10._0_4_ = local_88._4_4_ * auVar7._4_4_;
                    auVar36._0_8_ = auVar10._0_8_ << 0x20;
                    auVar36._8_4_ = local_88._8_4_ * auVar7._8_4_;
                    auVar36._12_4_ = local_88._12_4_ * auVar7._12_4_;
                    auVar37._8_8_ = auVar36._8_8_;
                    auVar37._0_8_ = auVar33._0_8_;
                    auVar43._0_4_ = (float)(int)lVar23;
                    auVar43._4_12_ = local_78._4_12_;
                    auVar7 = vrcpps_avx(auVar43);
                    auVar50._0_4_ = auVar33._0_4_ * auVar7._0_4_;
                    auVar50._4_4_ = auVar33._4_4_ * auVar7._4_4_;
                    auVar50._8_4_ = auVar36._8_4_ * auVar7._8_4_;
                    auVar50._12_4_ = auVar36._12_4_ * auVar7._12_4_;
                    auVar32 = vfmsub231ps_fma(auVar37,auVar43,auVar50);
                    auVar40 = vfnmadd213ps_fma(auVar32,auVar7,auVar50);
                    auVar44._0_4_ = (auVar33._0_4_ + auVar43._0_4_) * (float)local_a8._0_4_;
                    auVar44._4_4_ = (auVar33._4_4_ + local_78._4_4_) * (float)local_a8._4_4_;
                    auVar44._8_4_ = (auVar33._8_4_ + local_78._8_4_) * fStack_a0;
                    auVar44._12_4_ = (auVar33._12_4_ + local_78._12_4_) * fStack_9c;
                    auVar48._0_4_ = auVar40._0_4_ * (float)local_98._0_4_;
                    auVar48._4_4_ = auVar40._4_4_ * (float)local_98._4_4_;
                    auVar48._8_4_ = auVar40._8_4_ * fStack_90;
                    auVar48._12_4_ = auVar40._12_4_ * fStack_8c;
                    auVar7 = vshufpd_avx(auVar48,auVar44,1);
                    auVar32 = vsubps_avx(auVar44,auVar7);
                    auVar11._4_8_ = auVar48._8_8_;
                    auVar11._0_4_ = auVar48._4_4_ + auVar7._4_4_;
                    auVar49._0_8_ = auVar11._0_8_ << 0x20;
                    auVar49._8_4_ = auVar48._8_4_ + auVar7._8_4_;
                    auVar49._12_4_ = auVar48._12_4_ + auVar7._12_4_;
                    uVar17 = auVar49._8_8_;
                    auVar45 = ZEXT1664(CONCAT88(uVar17,auVar32._0_8_));
                    auVar7 = vmovshdup_avx(auVar40);
                    auVar38._0_4_ = auVar7._0_4_ * auVar40._0_4_;
                    auVar38._4_4_ = auVar7._4_4_ * auVar40._4_4_;
                    auVar38._8_4_ = auVar7._8_4_ * auVar40._8_4_;
                    auVar38._12_4_ = auVar7._12_4_ * auVar40._12_4_;
                    local_1a8.xmin = auVar32._0_4_;
                    local_1a8.ymin = auVar32._4_4_;
                    local_1a8.area = (float)vextractps_avx(auVar38,2);
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_1c8.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_180);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_1a8.score = fVar30;
                    local_1a8.xmax = auVar49._8_4_;
                    local_1a8.ymax = auVar49._12_4_;
                    local_1a8.label = iVar22;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_1a8);
                    }
                    else {
                      auVar13._8_4_ = local_1a8.area;
                      auVar13._0_8_ = uVar17;
                      auVar13._12_4_ = iVar22;
                      auVar45 = ZEXT1664(auVar13);
                      (__position._M_current)->xmax = (float)(int)uVar17;
                      (__position._M_current)->ymax = (float)(int)((ulong)uVar17 >> 0x20);
                      (__position._M_current)->area = local_1a8.area;
                      (__position._M_current)->label = iVar22;
                      (__position._M_current)->score = fVar30;
                      (__position._M_current)->xmin = local_1a8.xmin;
                      (__position._M_current)->ymin = local_1a8.ymin;
                      (__position._M_current)->xmax = auVar49._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                    }
                  }
                  local_108 = local_108 + 1;
                  local_110 = local_110 + 1;
                  local_118 = local_118 + 1;
                  local_120 = local_120 + 1;
                  pfVar27 = pfVar27 + 1;
                  lVar23 = lVar23 + 1;
                  in_R10 = local_d0;
                  uVar17 = local_c8;
                } while (lVar23 != local_d0);
              }
              lVar23 = local_e0 + 1;
            } while (lVar23 != local_128);
          }
          lVar23 = local_180 + 1;
          p_Var19 = (_func_int *)
                    ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 +
                    (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]);
        } while (lVar23 < *(int *)(&this->field_0xd4 +
                                  (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]));
      }
      if (0 < *(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3])) {
        lVar23 = 8;
        lVar26 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_178,
                     local_178.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     *(undefined8 *)
                      ((long)local_1c8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar23 + -8),
                     *(undefined8 *)
                      ((long)&((local_1c8.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar23));
          lVar26 = lVar26 + 1;
          lVar23 = lVar23 + 0x18;
        } while (lVar26 < *(int *)(&this->field_0xd4 +
                                  (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]));
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_1c8);
      local_1b0 = local_1b0 + 1;
    } while (local_1b0 <
             (ulong)(((long)(local_140->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_140->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]),&local_178);
  local_1a8.score = 0.0;
  local_1a8.xmin = 0.0;
  local_1a8.ymin = 0.0;
  local_1a8.xmax = 0.0;
  local_1a8.ymax = 0.0;
  local_1a8.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            ((Yolov3DetectionOutput *)
             ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx2 +
             (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]),&local_178,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1a8,
             *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86_avx2[-3]));
  local_1c8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  local_1c8.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar23 = CONCAT44(local_1a8.xmin,local_1a8.score);
  if (CONCAT44(local_1a8.xmax,local_1a8.ymin) != lVar23) {
    uVar29 = 0;
    do {
      __args = local_178.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar23 + uVar29 * 8);
      if (local_1c8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_1c8.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_1c8,
                   (iterator)
                   local_1c8.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        uVar17 = *(undefined8 *)__args;
        uVar12 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_1c8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_1c8.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar17;
        *(undefined8 *)
         ((long)local_1c8.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar12;
        local_1c8.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_1c8.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar29 = uVar29 + 1;
      lVar23 = CONCAT44(local_1a8.xmin,local_1a8.score);
    } while (uVar29 < (ulong)(CONCAT44(local_1a8.xmax,local_1a8.ymin) - lVar23 >> 3));
  }
  uVar28 = (int)((long)local_1c8.
                       super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1c8.
                       super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
  iVar14 = 0;
  if (uVar28 != 0) {
    this_01 = (local_100->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(this_01,6,uVar28,4,local_f8->blob_allocator);
    iVar14 = -100;
    if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
       (iVar14 = 0, 0 < (int)uVar28)) {
      iVar22 = this_01->w;
      sVar24 = this_01->elemsize;
      puVar18 = (undefined4 *)((long)this_01->data + 0x14);
      iVar14 = 0;
      lVar23 = 0;
      do {
        uVar21 = *(undefined4 *)
                  ((long)&((local_1c8.
                            super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar23);
        puVar18[-5] = (float)(*(int *)((long)&local_1c8.
                                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[1].
                                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar23) +
                             1);
        puVar18[-4] = uVar21;
        puVar18[-3] = *(undefined4 *)
                       ((long)&((local_1c8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar23 + 4);
        puVar18[-2] = *(undefined4 *)
                       ((long)&((local_1c8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar23);
        puVar18[-1] = *(undefined4 *)
                       ((long)&((local_1c8.
                                 super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar23 + 4);
        *puVar18 = *(undefined4 *)
                    ((long)&((local_1c8.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar23);
        lVar23 = lVar23 + 0x1c;
        puVar18 = (undefined4 *)((long)puVar18 + (long)iVar22 * sVar24);
      } while ((ulong)(uVar28 & 0x7fffffff) * 0x1c != lVar23);
    }
  }
  if (local_1c8.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar4 = (void *)CONCAT44(local_1a8.xmin,local_1a8.score);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT44(local_1a8.area,local_1a8.ymax) - (long)pvVar4);
  }
LAB_002b9189:
  if (local_178.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar14;
}

Assistant:

int Yolov3DetectionOutput_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}